

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O1

void __thiscall Rotation::transform(Rotation *this,TransformationData *transformationData)

{
  pointer ppQVar1;
  iterator __position;
  TransformationData *this_00;
  bool bVar2;
  vector<Quad*,std::allocator<Quad*>> *this_01;
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar3;
  pointer ppQVar4;
  float fVar5;
  Quad *local_40;
  TransformationData *local_38;
  
  bVar2 = TransformationData::isTwoState(transformationData);
  if (bVar2) {
    fVar5 = this->angleDegrees;
    this->angleDegrees = ABS(fVar5);
    this->angleRadians = (ABS(fVar5) * 3.1415927) / 180.0;
  }
  this_01 = (vector<Quad*,std::allocator<Quad*>> *)operator_new(0x18);
  *(undefined8 *)this_01 = 0;
  *(undefined8 *)(this_01 + 8) = 0;
  *(undefined8 *)(this_01 + 0x10) = 0;
  local_38 = transformationData;
  pvVar3 = TransformationData::getWorkingQuads(transformationData);
  ppQVar4 = (pvVar3->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppQVar1 = (pvVar3->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppQVar4 != ppQVar1) {
    do {
      local_40 = Quad::getRotatedQuad(*ppQVar4,this->pivotPoint,this->angleRadians);
      __position._M_current = *(Quad ***)(this_01 + 8);
      if (__position._M_current == *(Quad ***)(this_01 + 0x10)) {
        std::vector<Quad*,std::allocator<Quad*>>::_M_realloc_insert<Quad*>
                  (this_01,__position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      ppQVar4 = ppQVar4 + 1;
    } while (ppQVar4 != ppQVar1);
  }
  this_00 = local_38;
  TransformationData::rollforward(local_38);
  TransformationData::setWorkingQuads(this_00,(vector<Quad_*,_std::allocator<Quad_*>_> *)this_01);
  fVar5 = TransformationData::getWorkingRotation(this_00);
  TransformationData::setWorkingRotation(this_00,fVar5 + this->angleDegrees);
  return;
}

Assistant:

void Rotation::transform(TransformationData& transformationData) {
    if (transformationData.isTwoState()) {
        angleDegrees = abs(angleDegrees);
        angleRadians = angleDegrees * M_PI / 180;
    }
    
    vector<Quad*>* transformedQuads = new vector<Quad*>();
    for (auto quad : *transformationData.getWorkingQuads()) {
        transformedQuads->push_back(quad->getRotatedQuad(pivotPoint, angleRadians));
    }

    transformationData.rollforward();
    transformationData.setWorkingQuads(transformedQuads);
    transformationData.setWorkingRotation(transformationData.getWorkingRotation() + angleDegrees);
}